

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QFontDatabase::WritingSystem>::reserve
          (QList<QFontDatabase::WritingSystem> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<QFontDatabase::WritingSystem> *pQVar3;
  qsizetype qVar4;
  WritingSystem *b;
  Data *pDVar5;
  long in_RSI;
  QArrayDataPointer<QFontDatabase::WritingSystem> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QFontDatabase::WritingSystem> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QFontDatabase::WritingSystem> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QFontDatabase::WritingSystem> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QPodArrayOps<QFontDatabase::WritingSystem> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QFontDatabase::WritingSystem> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QArrayDataPointer<QFontDatabase::WritingSystem> *)
           capacity((QList<QFontDatabase::WritingSystem> *)0x74b2ef);
  qVar4 = QArrayDataPointer<QFontDatabase::WritingSystem>::freeSpaceAtBegin
                    (in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)pQVar3 - qVar4) {
    QArrayDataPointer<QFontDatabase::WritingSystem>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QFontDatabase::WritingSystem>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_0074b492;
    QArrayDataPointer<QFontDatabase::WritingSystem>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QFontDatabase::WritingSystem>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QFontDatabase::WritingSystem>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QFontDatabase::WritingSystem>::setFlag
                ((QArrayDataPointer<QFontDatabase::WritingSystem> *)0x74b396,(ArrayOptions)f.i);
      goto LAB_0074b492;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (WritingSystem *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QFontDatabase::WritingSystem> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QFontDatabase::WritingSystem>::QArrayDataPointer
            (pQVar3,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  pQVar3 = (QArrayDataPointer<QFontDatabase::WritingSystem> *)
           QArrayDataPointer<QFontDatabase::WritingSystem>::operator->(&local_38);
  QArrayDataPointer<QFontDatabase::WritingSystem>::operator->(in_RDI);
  b = QArrayDataPointer<QFontDatabase::WritingSystem>::begin
                ((QArrayDataPointer<QFontDatabase::WritingSystem> *)0x74b416);
  QArrayDataPointer<QFontDatabase::WritingSystem>::operator->(in_RDI);
  QArrayDataPointer<QFontDatabase::WritingSystem>::end(pQVar3);
  QtPrivate::QPodArrayOps<QFontDatabase::WritingSystem>::copyAppend
            (in_stack_ffffffffffffff90,b,(WritingSystem *)pQVar3);
  pDVar5 = QArrayDataPointer<QFontDatabase::WritingSystem>::d_ptr(&local_38);
  if (pDVar5 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QFontDatabase::WritingSystem> *)
         QArrayDataPointer<QFontDatabase::WritingSystem>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)pQVar3,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QFontDatabase::WritingSystem>::setFlag
              ((QArrayDataPointer<QFontDatabase::WritingSystem> *)0x74b479,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QFontDatabase::WritingSystem>::swap(pQVar3,in_stack_ffffffffffffff78);
  QArrayDataPointer<QFontDatabase::WritingSystem>::~QArrayDataPointer(pQVar3);
LAB_0074b492:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}